

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QString * QFileDialog::getOpenFileName
                    (QString *__return_storage_ptr__,QWidget *parent,QString *caption,QString *dir,
                    QString *filter,QString *selectedFilter,Options options)

{
  char cVar1;
  long in_FS_OFFSET;
  QUrl local_78;
  QUrl selectedUrl;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  selectedUrl.d = (QUrlPrivate *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_58,0,(QString *)&selectedUrl);
  QList<QString>::end((QList<QString> *)&local_58);
  if (selectedUrl.d != (QUrlPrivate *)0x0) {
    LOCK();
    *(int *)selectedUrl.d = *(int *)selectedUrl.d + -1;
    UNLOCK();
    if (*(int *)selectedUrl.d == 0) {
      QArrayData::deallocate((QArrayData *)selectedUrl.d,2,0x10);
    }
  }
  selectedUrl.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_78);
  getOpenFileUrl((QFileDialog *)&selectedUrl,parent,caption,&local_78,filter,selectedFilter,options,
                 (QStringList *)&local_58);
  QUrl::~QUrl(&local_78);
  cVar1 = QUrl::isLocalFile();
  if (cVar1 == '\0') {
    cVar1 = QUrl::isEmpty();
    if (cVar1 == '\0') {
      QUrl::toString(__return_storage_ptr__,&selectedUrl,0);
      goto LAB_004e5ae6;
    }
  }
  QUrl::toLocalFile();
LAB_004e5ae6:
  QUrl::~QUrl(&selectedUrl);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getOpenFileName(QWidget *parent,
                               const QString &caption,
                               const QString &dir,
                               const QString &filter,
                               QString *selectedFilter,
                               Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl = getOpenFileUrl(parent, caption, QUrl::fromLocalFile(dir), filter,
                                            selectedFilter, options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}